

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

bool slang::ast::anon_unknown_39::lookupDownward
               (span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                nameParts,NameComponents name,ASTContext *context,
               bitmask<slang::ast::LookupFlags> flags,LookupResult *result)

{
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  *this;
  char *pcVar1;
  size_t *psVar2;
  SourceLocation *pSVar3;
  undefined8 *puVar4;
  InterfacePortSymbol *pIVar5;
  uint uVar6;
  string_view name_00;
  string_view name_01;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  SourceRange sourceRange;
  SourceRange range;
  SourceRange range_00;
  __extent_storage<18446744073709551615UL> type;
  bool bVar7;
  DiagCode DVar9;
  uint uVar8;
  Type *this_00;
  Scope *this_01;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_02;
  uint64_t uVar10;
  ulong uVar11;
  DefinitionSymbol *pDVar12;
  Diagnostic *pDVar13;
  Symbol *pSVar14;
  byte bVar15;
  byte bVar16;
  DiagCode code;
  DiagCode code_00;
  long lVar17;
  SymbolKind SVar18;
  __extent_storage<18446744073709551615UL> _Var19;
  ulong uVar20;
  not_null<const_slang::ast::Scope_*> nVar21;
  pointer pNVar22;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *pSVar23;
  LookupResult *in_R9;
  long lVar25;
  NameComponents *pNVar26;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  undefined1 auVar27 [16];
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  byte bVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  byte bVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  byte bVar42;
  IfaceConn IVar43;
  SourceRange range_01;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors_00;
  SourceRange range_02;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  anon_class_24_3_69c2c931 checkClassParams;
  InterfacePortSymbol *local_f0;
  SourceLocation local_e8;
  __extent_storage<18446744073709551615UL> local_e0;
  pointer local_d8;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *local_d0;
  ulong local_c8;
  ulong local_c0;
  undefined4 local_b8;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  byte bStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  byte bStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  byte bStack_a9;
  ulong local_a0;
  char local_98;
  char cStack_97;
  char cStack_96;
  byte bStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  byte bStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  byte bStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  byte bStack_89;
  anon_class_24_3_69c2c931 local_80;
  _Variadic_union<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  local_68;
  undefined1 local_40;
  SourceLocation SVar24;
  
  _Var19 = nameParts._M_extent._M_extent_value;
  pNVar22 = nameParts._M_ptr;
  local_f0 = (InterfacePortSymbol *)result->found;
  result->found = (Symbol *)0x0;
  local_80.symbol = (Symbol **)&local_f0;
  local_d0 = &(result->path).super_SmallVectorBase<slang::ast::HierarchicalReference::Element>;
  local_c8 = _Var19._M_extent_value * -0x48;
  lVar25 = 0;
  uVar11 = 0;
  local_e8 = (SourceLocation)result;
  local_e0._M_extent_value = (size_t)context;
  local_d8 = pNVar22;
  local_b8 = flags.m_bits;
  local_80.result = result;
  local_80.context = context;
  while( true ) {
    lVar17 = local_c8 - lVar25;
    if (lVar17 == 0) goto LAB_002e8402;
    bVar7 = lookupDownward::anon_class_24_3_69c2c931::operator()(&local_80,&name);
    if (!bVar7) {
      return false;
    }
    uVar8 = (local_f0->super_Symbol).kind - ConstraintBlock;
    if ((uVar8 < 0x15) && ((0x182381U >> (uVar8 & 0x1f) & 1) != 0)) break;
    bVar7 = Symbol::isValue(&local_f0->super_Symbol);
    if (bVar7) {
      this_00 = DeclaredType::getType((DeclaredType *)&local_f0->interfaceDef);
      bVar7 = Type::isVirtualInterface(this_00);
      type._M_extent_value = local_e0._M_extent_value;
      if (!bVar7) break;
      Compilation::noteReference
                ((Compilation *)**(undefined8 **)(Symbol *)local_e0._M_extent_value,
                 &local_f0->super_Symbol,false);
      range_02.endLoc = (SourceLocation)result;
      range_02.startLoc = name.range.endLoc;
      local_f0 = (InterfacePortSymbol *)
                 getVirtualInterfaceTarget
                           ((anon_unknown_39 *)this_00,(Type *)type._M_extent_value,
                            (ASTContext *)name.range.startLoc,range_02);
      uVar11 = CONCAT71((int7)(type._M_extent_value >> 8),1);
    }
    SVar18 = (local_f0->super_Symbol).kind;
    if (lVar25 == 0) {
      if (SVar18 != CompilationUnit) {
        if (SVar18 == InterfacePort) {
          bVar15 = 0x20;
          goto LAB_002e8167;
        }
        if (SVar18 != Package) goto LAB_002e815d;
      }
    }
    else {
      if ((((local_b8 >> 10 & 1) != 0) && (SVar18 < ProceduralBlock)) &&
         ((0x182000000000000U >> ((ulong)SVar18 & 0x3f) & 1) != 0)) {
        nVar21.ptr = *(Scope **)(Symbol *)local_e0._M_extent_value;
        code_00.subsystem = Lookup;
        code_00.code = 0x13;
        SVar24 = (local_d8->name).range.endLoc;
        goto LAB_002e8801;
      }
LAB_002e815d:
      bVar15 = 2;
      if (SVar18 != ClockingBlock && (uVar11 & 1) == 0) {
LAB_002e8167:
        ((bitmask<slang::ast::LookupResultFlags> *)((long)local_e8 + 0x14))->m_bits =
             ((bitmask<slang::ast::LookupResultFlags> *)((long)local_e8 + 0x14))->m_bits | bVar15;
        SmallVectorBase<slang::ast::HierarchicalReference::Element>::
        emplace_back<slang::ast::Symbol_const&>(local_d0,&local_f0->super_Symbol);
      }
    }
    local_c0 = uVar11;
    if ((local_f0->super_Symbol).kind == InterfacePort) {
      IVar43 = InterfacePortSymbol::getConnection(local_f0);
      local_f0 = (InterfacePortSymbol *)IVar43.first;
      if (local_f0 == (InterfacePortSymbol *)0x0) {
        return false;
      }
    }
    else {
      IVar43.second = (ModportSymbol *)0x0;
      IVar43.first = &local_f0->super_Symbol;
    }
    bVar7 = Symbol::isScope(IVar43.first);
    if ((!bVar7) && (SVar18 = (local_f0->super_Symbol).kind, SVar18 != Instance)) {
LAB_002e849a:
      if (SVar18 == UninstantiatedDef) {
        return false;
      }
LAB_002e84a3:
      local_f0 = (InterfacePortSymbol *)
                 unwrapTypeParam(*(Scope **)(Symbol *)local_e0._M_extent_value,
                                 &local_f0->super_Symbol);
      if (local_f0 == (InterfacePortSymbol *)0x0) {
        return false;
      }
      bVar7 = Symbol::isType((Symbol *)local_f0);
      if (bVar7) {
        bVar7 = Type::isError((Type *)local_f0);
        if (bVar7) {
          return false;
        }
      }
      else {
        SVar18 = (local_f0->super_Symbol).kind;
        if (SVar18 != GenericClassDef) {
          DVar9.subsystem = Lookup;
          DVar9.code = 3;
          code.subsystem = Lookup;
          code.code = 0x21;
          if ((SVar18 & ~Root) == Checker) {
            code = DVar9;
          }
          bVar7 = false;
          goto LAB_002e8711;
        }
      }
      code.subsystem = Lookup;
      code.code = 9;
      bVar7 = true;
LAB_002e8711:
      pDVar13 = LookupResult::addDiag
                          ((LookupResult *)local_e8,*(Scope **)(Symbol *)local_e0._M_extent_value,
                           code,*(SourceLocation *)
                                 ((long)pNVar22 + lVar25 + _Var19._M_extent_value * 0x48 + -0x10));
      range.endLoc = name.range.endLoc;
      range.startLoc = name.range.startLoc;
      Diagnostic::operator<<(pDVar13,range);
      range_01.endLoc =
           *(SourceLocation *)((long)pNVar22 + lVar25 + _Var19._M_extent_value * 0x48 + -0x30);
      range_01.startLoc =
           *(SourceLocation *)((long)pNVar22 + lVar25 + _Var19._M_extent_value * 0x48 + -0x38);
      Diagnostic::operator<<(pDVar13,range_01);
      if (!bVar7) {
        arg_00._M_str = name.text._M_str;
        arg_00._M_len = name.text._M_len;
        Diagnostic::operator<<(pDVar13,arg_00);
      }
      Diagnostic::addNote(pDVar13,(DiagCode)0x50001,(local_f0->super_Symbol).location);
      return true;
    }
    bVar7 = Symbol::isType(&local_f0->super_Symbol);
    SVar18 = (local_f0->super_Symbol).kind;
    if (bVar7) goto LAB_002e849a;
    if (SVar18 == Checker) goto LAB_002e84a3;
    if (name.selectors._M_extent._M_extent_value != 0) {
      selectors._M_extent._M_extent_value = local_e0._M_extent_value;
      selectors._M_ptr = (pointer)name.selectors._M_extent._M_extent_value;
      result = (LookupResult *)local_e8;
      local_f0 = (InterfacePortSymbol *)
                 Lookup::selectChild((Lookup *)local_f0,(Symbol *)name.selectors._M_ptr,selectors,
                                     (ASTContext *)local_e8,in_R9);
      if (local_f0 == (InterfacePortSymbol *)0x0) {
        return false;
      }
      SVar18 = (local_f0->super_Symbol).kind;
    }
    if (SVar18 == GenerateBlock) {
      if (local_f0[1].super_Symbol.field_0x4 != '\0') {
        return true;
      }
    }
    else if (SVar18 == Instance) {
      pIVar5 = (InterfacePortSymbol *)(local_f0->modport)._M_str;
      local_f0 = pIVar5;
      if (IVar43.second != (ModportSymbol *)0x0) {
        local_f0 = (InterfacePortSymbol *)
                   Scope::find((Scope *)&pIVar5->interfaceDef,((IVar43.second)->super_Symbol).name);
      }
      if (*(int *)((long)pIVar5[1].super_Symbol.location + 0x48) == 2) {
        nVar21.ptr = *(Scope **)(Symbol *)local_e0._M_extent_value;
        bVar7 = isInProgram((nVar21.ptr)->thisSym);
        if (!bVar7) {
          result = *(LookupResult **)&(local_d8->name).range.endLoc;
          sourceRange_00.endLoc = (SourceLocation)result;
          sourceRange_00.startLoc = name.range.startLoc;
          LookupResult::addDiag
                    ((LookupResult *)local_e8,nVar21.ptr,(DiagCode)0xf000a,sourceRange_00);
        }
      }
    }
    psVar2 = (size_t *)((long)&pNVar22[_Var19._M_extent_value - 1].name.text._M_len + lVar25);
    name.text._M_len = *psVar2;
    name.text._M_str = (char *)psVar2[1];
    pSVar3 = (SourceLocation *)((long)pNVar22 + lVar25 + _Var19._M_extent_value * 0x48 + -0x38);
    name.range.startLoc = *pSVar3;
    name.range.endLoc = pSVar3[1];
    puVar4 = (undefined8 *)((long)pNVar22 + lVar25 + _Var19._M_extent_value * 0x48 + -0x28);
    name.selectors._M_ptr = (pointer)*puVar4;
    name.selectors._M_extent._M_extent_value = puVar4[1];
    name.paramAssignments =
         *(ParameterValueAssignmentSyntax **)
          ((long)pNVar22 + lVar25 + _Var19._M_extent_value * 0x48 + -0x18);
    if (name.text._M_len == 0) {
      return false;
    }
    this_01 = Symbol::scopeOrNull(&local_f0->super_Symbol);
    name_00._M_str = name.text._M_str;
    name_00._M_len = name.text._M_len;
    local_f0 = (InterfacePortSymbol *)Scope::find(this_01,name_00);
    if (local_f0 == (InterfacePortSymbol *)0x0) {
      pSVar14 = this_01->thisSym;
      pIVar5 = (InterfacePortSymbol *)0x0;
      if ((pSVar14->kind != Modport) ||
         (name_01._M_str = name.text._M_str, name_01._M_len = name.text._M_len,
         local_f0 = (InterfacePortSymbol *)Scope::find(pSVar14->parentScope,name_01),
         pIVar5 = local_f0, local_f0 == (InterfacePortSymbol *)0x0)) {
        local_f0 = pIVar5;
        this_02 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  Scope::getNameMap(this_01);
        uVar10 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           (this_02,&name.text);
        uVar20 = uVar10 >> ((byte)*this_02 & 0x3f);
        lVar17 = (uVar10 & 0xff) * 4;
        cVar28 = (&UNK_0042856c)[lVar17];
        cVar29 = (&UNK_0042856d)[lVar17];
        cVar30 = (&UNK_0042856e)[lVar17];
        bVar15 = (&UNK_0042856f)[lVar17];
        uVar11 = (ulong)((uint)uVar10 & 7);
        pSVar23 = (SmallVectorBase<slang::ast::HierarchicalReference::Element> *)0x0;
        cVar31 = cVar28;
        cVar32 = cVar29;
        cVar33 = cVar30;
        bVar34 = bVar15;
        cVar35 = cVar28;
        cVar36 = cVar29;
        cVar37 = cVar30;
        bVar38 = bVar15;
        cVar39 = cVar28;
        cVar40 = cVar29;
        cVar41 = cVar30;
        bVar42 = bVar15;
        goto LAB_002e854e;
      }
      bVar7 = SemanticFacts::isAllowedInModport((local_f0->super_Symbol).kind);
      if ((bVar7) || ((local_f0->super_Symbol).kind == Modport)) {
        pDVar12 = Symbol::getDeclaringDefinition(pSVar14);
        sourceRange.endLoc = name.range.endLoc;
        sourceRange.startLoc = name.range.startLoc;
        pDVar13 = LookupResult::addDiag
                            ((LookupResult *)local_e8,*(Scope **)(Symbol *)local_e0._M_extent_value,
                             (DiagCode)0x14000a,sourceRange);
        arg._M_str = name.text._M_str;
        arg._M_len = name.text._M_len;
        Diagnostic::operator<<(pDVar13,arg);
        Diagnostic::operator<<(pDVar13,(pDVar12->super_Symbol).name);
        Diagnostic::operator<<(pDVar13,pSVar14->name);
        return false;
      }
    }
    lVar25 = lVar25 + -0x48;
    uVar11 = local_c0;
  }
  this = (SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
          *)((long)local_e8 + 0x18);
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  ::
  append_range<std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
            (this,&name.selectors);
  pNVar26 = (NameComponents *)((long)&pNVar22[_Var19._M_extent_value].name.text._M_len + lVar25);
  while (lVar17 != 0) {
    local_68._M_first._M_storage =
         (_Uninitialized<const_slang::syntax::ElementSelectSyntax_*,_true>)
         *(undefined8 *)((long)(pNVar26 + 0xfffffffffffffffe) + 0x28);
    local_68._8_8_ =
         *(ParameterValueAssignmentSyntax **)((long)(pNVar26 + 0xfffffffffffffffe) + 0x30);
    local_68._16_8_ = *(undefined8 *)((long)(pNVar26 + 0xffffffffffffffff) + 0x28);
    local_68._24_8_ = pNVar26[0xffffffffffffffff].text._M_len;
    local_68._32_8_ = *(undefined8 *)((long)(pNVar26 + 0xffffffffffffffff) + 8);
    local_40 = 1;
    SmallVectorBase<std::variant<slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>>
    ::
    emplace_back<std::variant<slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>>
              ((SmallVectorBase<std::variant<slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>>
                *)this,(variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                        *)&local_68._M_first);
    SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    ::
    append_range<std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
              (this,(span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *
                    )((long)(pNVar26 + 0xffffffffffffffff) + 0x10));
    bVar7 = lookupDownward::anon_class_24_3_69c2c931::operator()
                      (&local_80,(NameComponents *)((long)(pNVar26 + 0xfffffffffffffffe) + 0x28U));
    lVar17 = lVar17 + 0x48;
    pNVar26 = (NameComponents *)((long)(pNVar26 + 0xfffffffffffffffe) + 0x28U);
    if (!bVar7) {
      return false;
    }
  }
  name.selectors._M_ptr = (pointer)0x0;
  name.selectors._M_extent._M_extent_value = 0;
LAB_002e8402:
  bVar7 = lookupDownward::anon_class_24_3_69c2c931::operator()(&local_80,&name);
  if (!bVar7) {
    return false;
  }
  bVar15 = ((bitmask<slang::ast::LookupResultFlags> *)((long)local_e8 + 0x14))->m_bits;
  if (local_f0 != (InterfacePortSymbol *)0x0 && (bVar15 & 0x22) != 0) {
    if ((bVar15 & 2) != 0) {
      uVar8 = (local_f0->super_Symbol).kind - Variable;
      if (((uVar8 < 0x19) && ((0x1800c0fU >> (uVar8 & 0x1f) & 1) != 0)) &&
         (*(int *)&local_f0[2].range.
                   super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                   ._M_payload == 0)) {
        nVar21.ptr = *(Scope **)(Symbol *)local_e0._M_extent_value;
        code_00.subsystem = Lookup;
        code_00.code = 1;
        SVar24 = name.range.endLoc;
LAB_002e8801:
        sourceRange_01.endLoc = SVar24;
        sourceRange_01.startLoc = name.range.startLoc;
        LookupResult::addDiag((LookupResult *)local_e8,nVar21.ptr,code_00,sourceRange_01);
        return false;
      }
      bVar7 = Symbol::isType(&local_f0->super_Symbol);
      if (bVar7) {
        nVar21.ptr = *(Scope **)(Symbol *)local_e0._M_extent_value;
        code_00.subsystem = Lookup;
        code_00.code = 0x31;
        SVar24 = name.range.endLoc;
        goto LAB_002e8801;
      }
    }
    SmallVectorBase<slang::ast::HierarchicalReference::Element>::
    emplace_back<slang::ast::Symbol_const&>(local_d0,&local_f0->super_Symbol);
  }
  *(InterfacePortSymbol **)local_e8 = local_f0;
  if (name.selectors._M_extent._M_extent_value == 0) {
    return true;
  }
  if (((local_f0 != (InterfacePortSymbol *)0x0) &&
      (bVar7 = Symbol::isScope(&local_f0->super_Symbol), bVar7)) &&
     (bVar7 = Symbol::isType(*(Symbol **)local_e8), SVar24 = local_e8, !bVar7)) {
    selectors_00._M_extent._M_extent_value = local_e0._M_extent_value;
    selectors_00._M_ptr = (pointer)name.selectors._M_extent._M_extent_value;
    pSVar14 = Lookup::selectChild(*(Lookup **)local_e8,(Symbol *)name.selectors._M_ptr,selectors_00,
                                  (ASTContext *)local_e8,in_R9);
    *(Symbol **)SVar24 = pSVar14;
    return true;
  }
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  ::
  append_range<std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
            ((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
              *)((long)local_e8 + 0x18),&name.selectors);
  return true;
  while( true ) {
    pcVar1 = pSVar23->firstElement;
    pSVar23 = (SmallVectorBase<slang::ast::HierarchicalReference::Element> *)
              ((long)&((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)
                      &pSVar23->data_)->data_ + 1);
    uVar20 = (ulong)(pcVar1 + (uVar20 - 0x17)) &
             (ulong)*(SmallVectorBase<slang::ast::HierarchicalReference::Element> **)(this_02 + 8);
    if (*(SmallVectorBase<slang::ast::HierarchicalReference::Element> **)(this_02 + 8) < pSVar23)
    break;
LAB_002e854e:
    pcVar1 = (char *)(*(long *)(this_02 + 0x10) + uVar20 * 0x10);
    local_98 = *pcVar1;
    cStack_97 = pcVar1[1];
    cStack_96 = pcVar1[2];
    bStack_95 = pcVar1[3];
    cStack_94 = pcVar1[4];
    cStack_93 = pcVar1[5];
    cStack_92 = pcVar1[6];
    bStack_91 = pcVar1[7];
    cStack_90 = pcVar1[8];
    cStack_8f = pcVar1[9];
    cStack_8e = pcVar1[10];
    bStack_8d = pcVar1[0xb];
    cStack_8c = pcVar1[0xc];
    cStack_8b = pcVar1[0xd];
    cStack_8a = pcVar1[0xe];
    bVar16 = pcVar1[0xf];
    auVar27[0] = -(local_98 == cVar28);
    auVar27[1] = -(cStack_97 == cVar29);
    auVar27[2] = -(cStack_96 == cVar30);
    auVar27[3] = -(bStack_95 == bVar15);
    auVar27[4] = -(cStack_94 == cVar31);
    auVar27[5] = -(cStack_93 == cVar32);
    auVar27[6] = -(cStack_92 == cVar33);
    auVar27[7] = -(bStack_91 == bVar34);
    auVar27[8] = -(cStack_90 == cVar35);
    auVar27[9] = -(cStack_8f == cVar36);
    auVar27[10] = -(cStack_8e == cVar37);
    auVar27[0xb] = -(bStack_8d == bVar38);
    auVar27[0xc] = -(cStack_8c == cVar39);
    auVar27[0xd] = -(cStack_8b == cVar40);
    auVar27[0xe] = -(cStack_8a == cVar41);
    auVar27[0xf] = -(bVar16 == bVar42);
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
    bStack_89 = bVar16;
    if (uVar8 != 0) {
      local_b8 = CONCAT13(bVar15,CONCAT12(cVar30,CONCAT11(cVar29,cVar28)));
      local_d8 = (pointer)(*(long *)(this_02 + 0x10) + uVar20 * 0x10);
      lVar17 = *(long *)(this_02 + 0x18);
      local_d0 = pSVar23;
      local_c8 = uVar20;
      cStack_b4 = cVar31;
      cStack_b3 = cVar32;
      cStack_b2 = cVar33;
      bStack_b1 = bVar34;
      cStack_b0 = cVar35;
      cStack_af = cVar36;
      cStack_ae = cVar37;
      bStack_ad = bVar38;
      cStack_ac = cVar39;
      cStack_ab = cVar40;
      cStack_aa = cVar41;
      bStack_a9 = bVar42;
      local_a0 = uVar11;
      do {
        local_c0 = (ulong)uVar8;
        uVar6 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)
              ((ulong)uVar6 * 0x18 + lVar17 + uVar20 * 0x168);
        bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           this_02,&name.text,__y);
        if (bVar7) {
          if (*(int *)__y[1]._M_len == 0x44) {
            return false;
          }
          goto LAB_002e86ca;
        }
        uVar8 = (uint)local_c0 - 1 & (uint)local_c0;
      } while (uVar8 != 0);
      bVar16 = *(byte *)((long)&(local_d8->name).text._M_str + 7);
      uVar11 = local_a0;
      uVar20 = local_c8;
      pSVar23 = local_d0;
      cVar28 = (char)local_b8;
      cVar29 = local_b8._1_1_;
      cVar30 = local_b8._2_1_;
      bVar15 = local_b8._3_1_;
      cVar31 = cStack_b4;
      cVar32 = cStack_b3;
      cVar33 = cStack_b2;
      bVar34 = bStack_b1;
      cVar35 = cStack_b0;
      cVar36 = cStack_af;
      cVar37 = cStack_ae;
      bVar38 = bStack_ad;
      cVar39 = cStack_ac;
      cVar40 = cStack_ab;
      cVar41 = cStack_aa;
      bVar42 = bStack_a9;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar11] & bVar16) == 0) break;
  }
LAB_002e86ca:
  if ((pSVar14->kind == GenerateBlockArray) || (pSVar14->kind == InstanceArray)) {
    LookupResult::addDiag
              ((LookupResult *)local_e8,*(Scope **)(Symbol *)local_e0._M_extent_value,
               (DiagCode)0x8000a,
               *(SourceLocation *)((long)pNVar22 + lVar25 + _Var19._M_extent_value * 0x48 + -0x10));
  }
  else {
    pDVar13 = LookupResult::addDiag
                        ((LookupResult *)local_e8,*(Scope **)(Symbol *)local_e0._M_extent_value,
                         (DiagCode)0x5000a,
                         *(SourceLocation *)
                          ((long)pNVar22 + lVar25 + _Var19._M_extent_value * 0x48 + -0x10));
    arg_01._M_str = name.text._M_str;
    arg_01._M_len = name.text._M_len;
    Diagnostic::operator<<(pDVar13,arg_01);
    range_00.endLoc = name.range.endLoc;
    range_00.startLoc = name.range.startLoc;
    Diagnostic::operator<<(pDVar13,range_00);
  }
  return true;
}

Assistant:

bool lookupDownward(std::span<const NamePlusLoc> nameParts, NameComponents name,
                    const ASTContext& context, bitmask<LookupFlags> flags, LookupResult& result) {
    const Symbol* symbol = std::exchange(result.found, nullptr);
    SLANG_ASSERT(symbol);

    // Helper function to check whether class parameter assignments have been
    // incorrectly supplied for a non-class symbol.
    auto checkClassParams = [&](const NameComponents& nc) {
        if (symbol && symbol->kind != SymbolKind::GenericClassDef && nc.paramAssignments) {
            auto& diag = result.addDiag(*context.scope, diag::NotAGenericClass,
                                        nc.paramAssignments->getFirstToken().location());
            diag << nc.range;
            diag << symbol->name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return false;
        }
        return true;
    };

    // Loop through each dotted name component and try to find it in the preceeding scope.
    bool isVirtualIface = false;
    for (auto it = nameParts.rbegin(); it != nameParts.rend(); it++) {
        if (!checkClassParams(name))
            return false;

        auto isValueLike = [&](const Symbol*& symbol) {
            switch (symbol->kind) {
                case SymbolKind::ConstraintBlock:
                case SymbolKind::Coverpoint:
                case SymbolKind::CoverCross:
                case SymbolKind::Sequence:
                case SymbolKind::Property:
                case SymbolKind::LetDecl:
                case SymbolKind::AssertionPort:
                    return true;
                default: {
                    if (!symbol->isValue())
                        return false;

                    // If this is a virtual interface value we should unwrap to
                    // the target interface and continue the hierarchical lookup.
                    auto& type = symbol->as<ValueSymbol>().getType();
                    if (type.isVirtualInterface()) {
                        isVirtualIface = true;
                        context.getCompilation().noteReference(*symbol);
                        symbol = getVirtualInterfaceTarget(type, context, name.range);
                        return false;
                    }

                    return true;
                }
            }
        };

        // If we found a value, the remaining dots are member access expressions.
        if (isValueLike(symbol)) {
            result.selectors.append_range(name.selectors);

            for (; it != nameParts.rend(); it++) {
                auto& memberName = it->name;
                result.selectors.push_back(LookupResult::MemberSelector{
                    memberName.text, it->dotLocation, memberName.range});

                result.selectors.append_range(memberName.selectors);

                if (!checkClassParams(memberName))
                    return false;
            }

            // Break out to return the symbol.
            name.selectors = {};
            break;
        }

        // This is a hierarchical lookup if we previously decided it was hierarchical, or:
        // - This is not a clocking block access
        // - This is not a virtual interface access (or descended from one)
        // - This is not a direct interface port, package, or $unit reference
        const bool isCBOrVirtualIface = symbol->kind == SymbolKind::ClockingBlock || isVirtualIface;
        if (it == nameParts.rbegin()) {
            if (symbol->kind == SymbolKind::InterfacePort) {
                result.flags |= LookupResultFlags::IfacePort;
                result.path.emplace_back(*symbol);
            }
            else if (symbol->kind != SymbolKind::Package &&
                     symbol->kind != SymbolKind::CompilationUnit && !isCBOrVirtualIface) {
                result.flags |= LookupResultFlags::IsHierarchical;
                result.path.emplace_back(*symbol);
            }
        }
        else if (flags.has(LookupFlags::IfacePortConn) &&
                 (symbol->kind == SymbolKind::GenerateBlock ||
                  symbol->kind == SymbolKind::GenerateBlockArray ||
                  symbol->kind == SymbolKind::InstanceArray)) {
            SourceRange errorRange{name.range.start(), (nameParts.rend() - 1)->name.range.end()};
            result.addDiag(*context.scope, diag::InvalidHierarchicalIfacePortConn, errorRange);
            return false;
        }
        else if (!isCBOrVirtualIface) {
            result.flags |= LookupResultFlags::IsHierarchical;
            result.path.emplace_back(*symbol);
        }

        const ModportSymbol* modport = nullptr;
        if (symbol->kind == SymbolKind::InterfacePort) {
            auto& ifacePort = symbol->as<InterfacePortSymbol>();
            std::tie(symbol, modport) = ifacePort.getConnection();
            if (!symbol)
                return false;
        }

        if ((!symbol->isScope() && symbol->kind != SymbolKind::Instance) || symbol->isType() ||
            symbol->kind == SymbolKind::Checker) {
            // If we found an uninstantiated def, exit silently. An appropriate error was
            // already issued, so no need to pile on.
            if (symbol->kind == SymbolKind::UninstantiatedDef)
                return false;

            symbol = unwrapTypeParam(*context.scope, symbol);
            if (!symbol)
                return false;

            bool isType;
            if (symbol->isType()) {
                isType = true;
                if (symbol->as<Type>().isError())
                    return false;
            }
            else {
                isType = symbol->kind == SymbolKind::GenericClassDef;
            }

            DiagCode code;
            if (isType) {
                code = diag::DotOnType;
            }
            else if (symbol->kind == SymbolKind::Checker ||
                     symbol->kind == SymbolKind::CheckerInstance) {
                code = diag::CheckerHierarchical;
            }
            else {
                code = diag::NotAHierarchicalScope;
            }

            auto& diag = result.addDiag(*context.scope, code, it->dotLocation);
            diag << name.range;
            diag << it->name.range;

            if (!isType)
                diag << name.text;

            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return true;
        }

        if (!name.selectors.empty()) {
            symbol = Lookup::selectChild(*symbol, name.selectors, context, result);
            if (!symbol)
                return false;
        }

        if (symbol->kind == SymbolKind::Instance) {
            auto& body = symbol->as<InstanceSymbol>().body;
            symbol = &body;

            // If we had a modport restriction on an interface port lookup
            // we should switch to doing the next lookup in that modport's scope.
            // We need to re-lookup the modport symbol because the one we have
            // is just representative; the real one depends on the result of the
            // selectChild call we made above in the case of an interface array.
            if (modport) {
                symbol = body.find(modport->name);
                SLANG_ASSERT(symbol);
            }

            // If we're descending into a program instance, verify that
            // the original scope for the lookup is also within a program.
            if (body.getDefinition().definitionKind == DefinitionKind::Program &&
                !isInProgram(context.scope->asSymbol())) {
                SourceRange errorRange{name.range.start(),
                                       (nameParts.rend() - 1)->name.range.end()};
                result.addDiag(*context.scope, diag::IllegalReferenceToProgramItem, errorRange);
            }
        }
        else if (symbol->kind == SymbolKind::GenerateBlock &&
                 symbol->as<GenerateBlockSymbol>().isUninstantiated) {
            // Don't allow lookups into uninstantiated generate blocks, but do return
            // true so that the lookup can continue elsewhere.
            return true;
        }

        name = it->name;
        if (name.text.empty())
            return false;

        auto& scope = symbol->as<Scope>();
        symbol = scope.find(name.text);
        if (!symbol) {
            // If we did the lookup in a modport, check to see if the symbol actually
            // exists in the parent interface.
            auto& prevSym = scope.asSymbol();
            if (prevSym.kind != SymbolKind::Modport ||
                (symbol = prevSym.getParentScope()->find(name.text)) == nullptr) {

                // Check if we actually had a method prototype found here but it failed
                // to resolve due to some other error, in which case we should keep quiet.
                auto& nameMap = scope.getNameMap();
                if (auto scopeIt = nameMap.find(name.text);
                    scopeIt != nameMap.end() &&
                    scopeIt->second->kind == SymbolKind::MethodPrototype) {
                    return false;
                }

                // Which error we report depends on whether this is an array
                // (in which case the user needs to use an index expression instead
                // of dot access) or just some other symbol that is missing the
                // requested member.
                if (prevSym.kind == SymbolKind::GenerateBlockArray ||
                    prevSym.kind == SymbolKind::InstanceArray) {
                    result.addDiag(*context.scope, diag::DotIntoInstArray, it->dotLocation);
                }
                else {
                    auto& diag = result.addDiag(*context.scope,
                                                diag::CouldNotResolveHierarchicalPath,
                                                it->dotLocation);
                    diag << name.text;
                    diag << name.range;
                }
                return true;
            }

            // Variables, nets, subroutines can only be accessed via the modport.
            // Other symbols aren't permitted in a modport, so they are allowed
            // to be accessed through it as if we had accessed the interface
            // instance itself.
            if (SemanticFacts::isAllowedInModport(symbol->kind) ||
                symbol->kind == SymbolKind::Modport) {
                // This is an error, the modport disallows access.
                auto def = prevSym.getDeclaringDefinition();
                SLANG_ASSERT(def);

                auto& diag = result.addDiag(*context.scope, diag::InvalidModportAccess, name.range);
                diag << name.text;
                diag << def->name;
                diag << prevSym.name;
                return false;
            }
        }
    }

    if (!checkClassParams(name))
        return false;

    if (result.flags.has(LookupResultFlags::IsHierarchical | LookupResultFlags::IfacePort) &&
        symbol) {
        if (result.flags.has(LookupResultFlags::IsHierarchical)) {
            if (VariableSymbol::isKind(symbol->kind) &&
                symbol->as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                // If we found an automatic variable check that we didn't try to reference it
                // hierarchically.
                result.addDiag(*context.scope, diag::AutoVariableHierarchical, name.range);
                return false;
            }
            else if (symbol->isType()) {
                // Types cannot be referenced hierarchically.
                result.addDiag(*context.scope, diag::TypeHierarchical, name.range);
                return false;
            }
        }
        result.path.emplace_back(*symbol);
    }

    result.found = symbol;

    if (!name.selectors.empty()) {
        // If this is a scope, the selectors should be an index into it.
        if (result.found && result.found->isScope() && !result.found->isType())
            result.found = Lookup::selectChild(*result.found, name.selectors, context, result);
        else
            result.selectors.append_range(name.selectors);
    }

    return true;
}